

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O2

void Min_CoverWriteStore(FILE *pFile,Min_Man_t *p)

{
  Min_Cube_t *pCube;
  ulong uVar1;
  
  for (uVar1 = 0; (long)uVar1 <= (long)p->nVars; uVar1 = uVar1 + 1) {
    pCube = (Min_Cube_t *)(p->ppStore + uVar1);
    while (pCube = pCube->pNext, pCube != (Min_Cube_t *)0x0) {
      printf("%2d : ",uVar1 & 0xffffffff);
      if (pCube == p->pBubble) {
        puts("Bubble");
      }
      else {
        Min_CubeWrite(pFile,pCube);
      }
    }
  }
  putchar(10);
  return;
}

Assistant:

void Min_CoverWriteStore( FILE * pFile, Min_Man_t * p )
{
    Min_Cube_t * pCube;
    int i;
    for ( i = 0; i <= p->nVars; i++ )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        {
            printf( "%2d : ", i );
            if ( pCube == p->pBubble )
            {
                printf( "Bubble\n" );
                continue;
            }
            Min_CubeWrite( pFile, pCube );
        }
    }
    printf( "\n" );
}